

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

void * ZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  PHYSFS_uint64 local_58;
  PHYSFS_uint64 count;
  PHYSFS_uint64 cdir_ofs;
  PHYSFS_uint64 dstart;
  ZIPentry *root;
  ZIPinfo *info;
  int *claimed_local;
  char *pcStack_20;
  int forWriting_local;
  char *name_local;
  PHYSFS_Io *io_local;
  
  root = (ZIPentry *)0x0;
  dstart = 0;
  cdir_ofs = 0;
  info = (ZIPinfo *)claimed;
  claimed_local._4_4_ = forWriting;
  pcStack_20 = name;
  name_local = (char *)io;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                  ,0x5be,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = isZip(io);
    if (iVar1 != 0) {
      *(undefined4 *)&(info->tree).root = 1;
      root = (ZIPentry *)(*__PHYSFS_AllocatorHooks.Malloc)(0x30);
      if (root == (ZIPentry *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      }
      else {
        memset(root,0,0x30);
        *(char **)&(root->tree).isdir = name_local;
        iVar1 = zip_parse_end_of_central_dir((ZIPinfo *)root,&cdir_ofs,&count,&local_58);
        if ((iVar1 != 0) &&
           (iVar1 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)root,0x70), iVar1 != 0)) {
          dstart = (PHYSFS_uint64)(root->tree).name;
          *(char *)(dstart + 0x30) = '\x04';
          *(char *)(dstart + 0x31) = '\0';
          *(char *)(dstart + 0x32) = '\0';
          *(char *)(dstart + 0x33) = '\0';
          iVar1 = zip_load_entries((ZIPinfo *)root,cdir_ofs,count,local_58);
          if (iVar1 != 0) {
            if (*(long *)((root->tree).name + 0x18) != 0) {
              __assert_fail("info->tree.root->sibling == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                            ,0x5d6,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
            }
            return root;
          }
        }
        *(undefined8 *)&(root->tree).isdir = 0;
        ZIP_closeArchive(root);
      }
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_READ_ONLY);
  }
  return (void *)0x0;
}

Assistant:

static void *ZIP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    ZIPinfo *info = NULL;
    ZIPentry *root = NULL;
    PHYSFS_uint64 dstart = 0;  /* data start */
    PHYSFS_uint64 cdir_ofs;  /* central dir offset */
    PHYSFS_uint64 count;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!isZip(io), NULL);

    *claimed = 1;

    info = (ZIPinfo *) allocator.Malloc(sizeof (ZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (ZIPinfo));

    info->io = io;

    if (!zip_parse_end_of_central_dir(info, &dstart, &cdir_ofs, &count))
        goto ZIP_openarchive_failed;
    else if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (ZIPentry)))
        goto ZIP_openarchive_failed;

    root = (ZIPentry *) info->tree.root;
    root->resolved = ZIP_DIRECTORY;

    if (!zip_load_entries(info, dstart, cdir_ofs, count))
        goto ZIP_openarchive_failed;

    assert(info->tree.root->sibling == NULL);
    return info;

ZIP_openarchive_failed:
    info->io = NULL;  /* don't let ZIP_closeArchive destroy (io). */
    ZIP_closeArchive(info);
    return NULL;
}